

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

void proxy_worker_func(worker_handle *wh)

{
  long *plVar1;
  mutex_handle *pmVar2;
  long *plVar3;
  proxy_conn_handle *ppVar4;
  proxy_handle *ppVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  size_t data_len;
  proxy_conn_handle **pppVar9;
  long lVar10;
  char *pcVar11;
  proxy_conn_handle ***ppppVar12;
  proxy_conn_handle *pc;
  long lVar13;
  ulong uVar14;
  undefined1 *buff_00;
  bool bVar15;
  uint32_t nonce;
  uint8_t buff [28];
  uint8_t response [16];
  char nonce_str [9];
  char remote_addr [54];
  uint32_t local_c4;
  long local_c0;
  mutex_handle *local_b8;
  mutex_handle *local_b0;
  uint8_t local_a8 [32];
  uint8_t local_88 [23];
  uint8_t local_71 [9];
  char local_68 [56];
  
  plVar3 = (long *)wh->func_ctx;
  lVar13 = *(long *)*plVar3;
  pmVar2 = (mutex_handle *)(plVar3 + 3);
  mutex_lock_shared(pmVar2);
  if (plVar3[1] == 0) {
    proxy_log((proxy_handle *)*plVar3,LOG_LEVEL_ERROR,
              "New connection was signaled, but no connection was given\n");
    mutex_unlock_shared(pmVar2);
    return;
  }
  mutex_unlock_shared(pmVar2);
  conn_get_remote_addr((conn_handle *)plVar3[1],local_68);
  proxy_log((proxy_handle *)*plVar3,LOG_LEVEL_DEBUG,
            "New connection - beginning authorization procedure\n");
  iVar7 = rand_get(&local_c4);
  if (-1 < iVar7) {
    digest_to_hex32(local_c4,(char *)local_71);
    get_password_response(local_c4,*(char **)(*plVar3 + 0x30),local_88);
    iVar7 = conn_send((conn_handle *)plVar3[1],local_71,8);
    if ((-1 < iVar7) && (iVar7 = conn_recv((conn_handle *)plVar3[1],local_a8,0x10), -1 < iVar7)) {
      uVar14 = 0;
      do {
        if (local_a8[uVar14] == '\n') goto LAB_00105099;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0xb);
      uVar14 = 0xb;
LAB_00105099:
      iVar7 = -0x16;
      if (uVar14 < 0xb) {
        local_a8[uVar14] = '\0';
        plVar1 = plVar3 + 8;
        strcpy((char *)plVar1,(char *)local_a8);
        iVar7 = conn_recv((conn_handle *)plVar3[1],local_a8 + 0x10,uVar14 + 1);
        if (-1 < iVar7) {
          lVar10 = 0;
          buff_00 = proxy_worker_authorize_msg_bad_pw;
          pcVar11 = "Client \'%s\' supplied an incorrect password. Dropping...\n";
          do {
            if (local_88[lVar10] != local_a8[lVar10 + uVar14 + 1]) goto LAB_00105123;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x10);
          iVar8 = proxy_authorize_callsign((proxy_handle *)*plVar3,(char *)plVar1);
          iVar7 = 0;
          if (iVar8 == 0) {
            buff_00 = proxy_worker_authorize_msg_bad_auth;
            pcVar11 = "Client \'%s\' is not authorized to use this proxy. Dropping...\n";
LAB_00105123:
            proxy_log((proxy_handle *)*plVar3,LOG_LEVEL_INFO,pcVar11,plVar1);
            iVar8 = conn_send((conn_handle *)plVar3[1],buff_00,10);
            iVar7 = -0xd;
            if (iVar8 < 0) {
              iVar7 = iVar8;
            }
          }
        }
      }
    }
  }
  if (-1 < iVar7) {
    local_b0 = pmVar2;
    proxy_update_registration((proxy_handle *)*plVar3);
    plVar1 = plVar3 + 8;
    data_len = strlen((char *)plVar1);
    bVar6 = pearson_get((uint8_t *)plVar1,data_len);
    proxy_log((proxy_handle *)*plVar3,LOG_LEVEL_DEBUG,"Searching callsign bucket %u\n");
    pmVar2 = (mutex_handle *)(lVar13 + 0x878);
    mutex_lock(pmVar2);
    if (*(long *)(lVar13 + 8) == 0) {
      mutex_unlock(pmVar2);
      proxy_log((proxy_handle *)*plVar3,LOG_LEVEL_ERROR,"Idle slot pool is empty.\n");
    }
    else {
      pc = *(proxy_conn_handle **)(lVar13 + 0x18 + (ulong)bVar6 * 8);
      bVar15 = pc == (proxy_conn_handle *)0x0;
      local_c0 = lVar13;
      local_b8 = pmVar2;
      if (!bVar15) {
        do {
          iVar7 = proxy_conn_accept(pc,(conn_handle *)plVar3[1],(char *)plVar1,'\x01');
          if (iVar7 != -0x10) goto LAB_001052f5;
          pc = pc->next_by_call;
          bVar15 = pc == (proxy_conn_handle *)0x0;
        } while (!bVar15);
        iVar7 = -0x10;
      }
LAB_001052f5:
      if (bVar15) {
        pc = *(proxy_conn_handle **)(local_c0 + 8);
        iVar7 = proxy_conn_accept(pc,(conn_handle *)plVar3[1],(char *)plVar1,'\0');
      }
      pmVar2 = local_b8;
      if (iVar7 < 0) {
        mutex_unlock(local_b8);
        ppVar5 = (proxy_handle *)*plVar3;
        pcVar11 = strerror(-iVar7);
        proxy_log(ppVar5,LOG_LEVEL_ERROR,"Failed to acquire slot (%d): %s\n",(ulong)(uint)-iVar7,
                  pcVar11);
        lVar13 = local_c0;
      }
      else {
        pppVar9 = (proxy_conn_handle **)(local_c0 + (ulong)bVar6 * 8 + 0x18);
        *pc->prev_ptr = pc->next;
        ppppVar12 = &pc->next->prev_ptr;
        if (pc->next == (proxy_conn_handle *)0x0) {
          ppppVar12 = (proxy_conn_handle ***)(local_c0 + 0x10);
        }
        *ppppVar12 = pc->prev_ptr;
        if (pc->prev_by_call_ptr != (proxy_conn_handle **)0x0) {
          *pc->prev_by_call_ptr = pc->next_by_call;
          if (pc->next_by_call != (proxy_conn_handle *)0x0) {
            pc->next_by_call->prev_by_call_ptr = pc->prev_by_call_ptr;
          }
        }
        pc->prev_by_call_ptr = pppVar9;
        ppVar4 = *pppVar9;
        pc->next_by_call = ppVar4;
        if (ppVar4 != (proxy_conn_handle *)0x0) {
          ppVar4->prev_by_call_ptr = &pc->next_by_call;
        }
        *pppVar9 = pc;
        mutex_unlock(local_b8);
        do {
          iVar7 = proxy_conn_process(pc);
        } while (-1 < iVar7);
        proxy_log((proxy_handle *)*plVar3,LOG_LEVEL_INFO,"Disconnected from client \'%s\'.\n",plVar1
                 );
        proxy_conn_finish(pc);
        pc->next = (proxy_conn_handle *)0x0;
        mutex_lock(pmVar2);
        lVar13 = local_c0;
        pppVar9 = *(proxy_conn_handle ***)(local_c0 + 0x10);
        pc->prev_ptr = pppVar9;
        *pppVar9 = pc;
        *(proxy_conn_handle ***)(local_c0 + 0x10) = &pc->next;
        mutex_unlock(pmVar2);
      }
    }
    pmVar2 = local_b0;
    mutex_lock(local_b0);
    conn_free((conn_handle *)plVar3[1]);
    free((void *)plVar3[1]);
    plVar3[1] = 0;
    mutex_unlock(pmVar2);
    mutex_lock((mutex_handle *)(lVar13 + 0x880));
    plVar3[2] = *(long *)(lVar13 + 0x820);
    *(long **)(lVar13 + 0x820) = plVar3;
    mutex_unlock((mutex_handle *)(lVar13 + 0x880));
    proxy_update_registration((proxy_handle *)*plVar3);
    proxy_log((proxy_handle *)*plVar3,LOG_LEVEL_DEBUG,"Client worker is returning cleanly.\n");
    return;
  }
  if (iVar7 < -0x20) {
    if ((iVar7 == -0x6b) || (iVar7 == -0x68)) {
LAB_00105281:
      proxy_log((proxy_handle *)*plVar3,LOG_LEVEL_WARN,
                "Connection to client was lost before authorization could complete\n");
      goto LAB_00105298;
    }
  }
  else if ((iVar7 == -4) || (iVar7 == -0x20)) goto LAB_00105281;
  ppVar5 = (proxy_handle *)*plVar3;
  pcVar11 = strerror(-iVar7);
  proxy_log(ppVar5,LOG_LEVEL_ERROR,"Authorization failed for client \'%s\' (%d): %s\n",local_68,
            (ulong)(uint)-iVar7,pcVar11);
LAB_00105298:
  mutex_lock(pmVar2);
  conn_free((conn_handle *)plVar3[1]);
  free((void *)plVar3[1]);
  plVar3[1] = 0;
  mutex_unlock(pmVar2);
  mutex_lock((mutex_handle *)(lVar13 + 0x880));
  plVar3[2] = *(long *)(lVar13 + 0x820);
  *(long **)(lVar13 + 0x820) = plVar3;
  mutex_unlock((mutex_handle *)(lVar13 + 0x880));
  return;
}

Assistant:

static void proxy_worker_func(struct worker_handle *wh)
{
	struct proxy_worker *pw = wh->func_ctx;
	struct proxy_priv *priv = pw->ph->priv;
	struct proxy_conn_handle *pc = NULL;
	int ret;
	char remote_addr[54];
	uint8_t hash;

	mutex_lock_shared(&pw->mutex);

	if (pw->conn_client == NULL) {
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "New connection was signaled, but no connection was given\n");

		mutex_unlock_shared(&pw->mutex);

		return;
	}

	mutex_unlock_shared(&pw->mutex);

	conn_get_remote_addr(pw->conn_client, remote_addr);

	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "New connection - beginning authorization procedure\n");

	ret = proxy_worker_authorize(pw);
	if (ret < 0) {
		switch (ret) {
		case -ECONNRESET:
		case -EINTR:
		case -ENOTCONN:
		case -EPIPE:
			proxy_log(pw->ph, LOG_LEVEL_WARN,
				  "Connection to client was lost before authorization could complete\n");
			break;
		default:
			proxy_log(pw->ph, LOG_LEVEL_ERROR,
				  "Authorization failed for client '%s' (%d): %s\n",
				  remote_addr, -ret, strerror(-ret));
		}

		mutex_lock(&pw->mutex);
		conn_free(pw->conn_client);
		free(pw->conn_client);
		pw->conn_client = NULL;
		mutex_unlock(&pw->mutex);

		mutex_lock(&priv->idle_workers_mutex);
		pw->next = priv->idle_workers_head;
		priv->idle_workers_head = pw;
		mutex_unlock(&priv->idle_workers_mutex);

		return;
	}

	proxy_update_registration(pw->ph);

	hash = pearson_get((uint8_t *)pw->callsign, strlen(pw->callsign));
	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "Searching callsign bucket %u\n", hash);

	mutex_lock(&priv->idle_clients_mutex);
	if (priv->idle_clients_head == NULL) {
		mutex_unlock(&priv->idle_clients_mutex);
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "Idle slot pool is empty.\n");
		goto proxy_worker_func_exit;
	}

	pc = priv->clients_by_call[hash];
	/* First, check for a reconnect */
	while (pc != NULL) {
		ret = proxy_conn_accept(pc, pw->conn_client, pw->callsign, 1);
		if (ret != -EBUSY)
			break;
		pc = pc->next_by_call;
	}
	/* Fall back on the oldest available slot */
	if (pc == NULL) {
		pc = priv->idle_clients_head;
		ret = proxy_conn_accept(pc, pw->conn_client, pw->callsign, 0);
	}
	if (ret < 0) {
		mutex_unlock(&priv->idle_clients_mutex);
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "Failed to acquire slot (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_worker_func_exit;
	}

	/* Remove the slot from the pool */
	*pc->prev_ptr = pc->next;
	if (pc->next == NULL)
		priv->idle_clients_tail_ptr = pc->prev_ptr;
	else
		pc->next->prev_ptr = pc->prev_ptr;

	/* Remove the slot from the hash map */
	if (pc->prev_by_call_ptr != NULL) {
		*pc->prev_by_call_ptr = pc->next_by_call;
		if (pc->next_by_call)
			pc->next_by_call->prev_by_call_ptr = pc->prev_by_call_ptr;
	}

	/* Add the slot to the hash map */
	pc->prev_by_call_ptr = &priv->clients_by_call[hash];
	pc->next_by_call = priv->clients_by_call[hash];
	if (pc->next_by_call != NULL)
		pc->next_by_call->prev_by_call_ptr = &pc->next_by_call;
	priv->clients_by_call[hash] = pc;
	mutex_unlock(&priv->idle_clients_mutex);

	do {
		ret = proxy_conn_process(pc);
	} while (ret >= 0);

	proxy_log(pw->ph, LOG_LEVEL_INFO,
		  "Disconnected from client '%s'.\n", pw->callsign);

	proxy_conn_finish(pc);

	/* Put the slot back in the pool */
	pc->next = NULL;
	mutex_lock(&priv->idle_clients_mutex);
	pc->prev_ptr = priv->idle_clients_tail_ptr;
	*priv->idle_clients_tail_ptr = pc;
	priv->idle_clients_tail_ptr = &pc->next;
	mutex_unlock(&priv->idle_clients_mutex);

proxy_worker_func_exit:
	mutex_lock(&pw->mutex);
	conn_free(pw->conn_client);
	free(pw->conn_client);
	pw->conn_client = NULL;
	mutex_unlock(&pw->mutex);

	mutex_lock(&priv->idle_workers_mutex);
	pw->next = priv->idle_workers_head;
	priv->idle_workers_head = pw;
	mutex_unlock(&priv->idle_workers_mutex);

	proxy_update_registration(pw->ph);

	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "Client worker is returning cleanly.\n");
}